

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

object class_new(klass cls,char *name,constructor ctor,void **args,size_t argc)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  object obj;
  object local_8;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 8) == 0)) {
    local_8 = (object)0x0;
  }
  else {
    local_8 = (object)(**(code **)(in_RDI[3] + 8))(in_RDI,in_RDI[2],in_RSI,in_RDX,in_RCX,in_R8);
    if (local_8 == (object)0x0) {
      log_write_impl_va("metacall",0x1e0,"class_new",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_class.c"
                        ,3,"Invalid class (%s) constructor <%p>",*in_RDI,
                        *(undefined8 *)(in_RDI[3] + 0x18));
      local_8 = (object)0x0;
    }
  }
  return local_8;
}

Assistant:

object class_new(klass cls, const char *name, constructor ctor, class_args args, size_t argc)
{
	if (cls != NULL && cls->interface != NULL && cls->interface->constructor != NULL)
	{
		object obj = cls->interface->constructor(cls, cls->impl, name, ctor, args, argc);

		if (obj == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class (%s) constructor <%p>", cls->name, cls->interface->static_set);

			return NULL;
		}

		return obj;
	}

	return NULL;
}